

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O1

Vec_Int_t * Amap_CreateRulesVector_rec(Amap_Lib_t *p,Vec_Ptr_t *vVecNods,int fXor)

{
  ulong uVar1;
  void *pvVar2;
  int iVar3;
  Vec_Int_t *vNods;
  int *piVar4;
  Vec_Ptr_t *vVecNods_00;
  void **ppvVar5;
  Vec_Ptr_t *vVecNods_01;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  size_t __size;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  long local_68;
  
  uVar10 = vVecNods->nSize;
  uVar9 = (ulong)uVar10;
  if (uVar9 == 1) {
    pvVar2 = *vVecNods->pArray;
    vNods = (Vec_Int_t *)malloc(0x10);
    iVar3 = *(int *)((long)pvVar2 + 4);
    lVar12 = (long)iVar3;
    vNods->nSize = iVar3;
    vNods->nCap = iVar3;
    if (lVar12 == 0) {
      piVar4 = (int *)0x0;
    }
    else {
      piVar4 = (int *)malloc(lVar12 * 4);
    }
    vNods->pArray = piVar4;
    memcpy(piVar4,*(void **)((long)pvVar2 + 8),lVar12 << 2);
  }
  else {
    vNods = (Vec_Int_t *)malloc(0x10);
    vNods->nCap = 0x10;
    vNods->nSize = 0;
    piVar4 = (int *)malloc(0x40);
    vNods->pArray = piVar4;
    vVecNods_00 = (Vec_Ptr_t *)malloc(0x10);
    uVar16 = (ulong)(uVar10 - 1);
    uVar13 = 8;
    if (6 < uVar10 - 1) {
      uVar13 = uVar10;
    }
    vVecNods_00->nSize = 0;
    vVecNods_00->nCap = uVar13;
    if (uVar13 == 0) {
      ppvVar5 = (void **)0x0;
    }
    else {
      ppvVar5 = (void **)malloc((long)(int)uVar13 * 8);
    }
    vVecNods_00->pArray = ppvVar5;
    vVecNods_01 = (Vec_Ptr_t *)malloc(0x10);
    vVecNods_01->nSize = 0;
    vVecNods_01->nCap = uVar13;
    if (uVar13 == 0) {
      ppvVar5 = (void **)0x0;
    }
    else {
      ppvVar5 = (void **)malloc((long)(int)uVar13 << 3);
    }
    vVecNods_01->pArray = ppvVar5;
    uVar6 = uVar9;
    do {
      iVar3 = (int)uVar6;
      if (iVar3 < 1) goto LAB_0044670e;
      lVar12 = uVar6 - 1;
    } while ((*(int *)((long)vVecNods->pArray[lVar12] + 4) == 1) &&
            (uVar6 = uVar6 - 1, **(int **)((long)vVecNods->pArray[lVar12] + 8) == 0));
    if (iVar3 < 1) {
LAB_0044670e:
      if (1 < (int)uVar10) {
        local_68 = uVar16 * 8;
        do {
          iVar3 = (int)uVar9;
          uVar9 = (ulong)(iVar3 - 1);
          vVecNods_00->nSize = 0;
          vVecNods_01->nSize = 0;
          uVar6 = 0;
          do {
            if ((long)vVecNods->nSize <= (long)uVar6) goto LAB_0044698e;
            pvVar2 = vVecNods->pArray[uVar6];
            uVar10 = vVecNods_00->nCap;
            if (uVar6 == uVar10) {
              if ((int)uVar10 < 0x10) {
                if (vVecNods_00->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(vVecNods_00->pArray,0x80);
                }
                iVar15 = 0x10;
              }
              else {
                iVar15 = uVar10 * 2;
                if (iVar15 <= (int)uVar10) goto LAB_004467b8;
                __size = (ulong)uVar10 << 4;
                if (vVecNods_00->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(__size);
                }
                else {
                  ppvVar5 = (void **)realloc(vVecNods_00->pArray,__size);
                }
              }
              vVecNods_00->pArray = ppvVar5;
              vVecNods_00->nCap = iVar15;
            }
LAB_004467b8:
            uVar1 = uVar6 + 1;
            vVecNods_00->nSize = (int)uVar1;
            vVecNods_00->pArray[uVar6] = pvVar2;
            uVar6 = uVar1;
          } while (uVar16 != uVar1);
          if (iVar3 <= vVecNods->nSize) {
            uVar10 = vVecNods_01->nCap;
            ppvVar5 = vVecNods_01->pArray;
            uVar6 = 0;
            do {
              pvVar2 = *(void **)((long)vVecNods->pArray + uVar6 * 8 + local_68);
              if (uVar6 == uVar10) {
                if ((int)uVar10 < 0x10) {
                  if (ppvVar5 == (void **)0x0) {
                    ppvVar5 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar5 = (void **)realloc(ppvVar5,0x80);
                  }
                  uVar10 = 0x10;
                }
                else {
                  uVar13 = uVar10 * 2;
                  if (SBORROW4(uVar10,uVar13) != 0 < (int)uVar10) {
                    uVar10 = uVar13;
                    if (ppvVar5 == (void **)0x0) {
                      ppvVar5 = (void **)malloc((ulong)uVar13 << 3);
                    }
                    else {
                      ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar13 << 3);
                    }
                  }
                }
              }
              ppvVar5[uVar6] = pvVar2;
              uVar6 = uVar6 + 1;
            } while ((int)uVar6 + (int)uVar16 < vVecNods->nSize);
            vVecNods_01->nCap = uVar10;
            vVecNods_01->pArray = ppvVar5;
            vVecNods_01->nSize = (int)uVar6;
          }
          pVVar7 = Amap_CreateRulesVector_rec(p,vVecNods_00,fXor);
          pVVar8 = Amap_CreateRulesVector_rec(p,vVecNods_01,fXor);
          Amap_CreateRulesTwo(p,vNods,pVVar7,pVVar8,fXor);
          if (pVVar7->pArray != (int *)0x0) {
            free(pVVar7->pArray);
            pVVar7->pArray = (int *)0x0;
          }
          if (pVVar7 != (Vec_Int_t *)0x0) {
            free(pVVar7);
          }
          if (pVVar8->pArray != (int *)0x0) {
            free(pVVar8->pArray);
            pVVar8->pArray = (int *)0x0;
          }
          if (pVVar8 != (Vec_Int_t *)0x0) {
            free(pVVar8);
          }
          uVar16 = uVar16 - 1;
          local_68 = local_68 + -8;
        } while (2 < iVar3);
      }
    }
    else {
      iVar3 = 1 << ((byte)uVar10 & 0x1f);
      if (3 < iVar3) {
        uVar10 = 1;
        do {
          uVar13 = 0;
          vVecNods_00->nSize = 0;
          vVecNods_01->nSize = 0;
          uVar14 = 0;
          if (0 < (long)vVecNods->nSize) {
            uVar14 = 0;
            lVar12 = (long)vVecNods->nSize;
            uVar11 = 0;
            do {
              if (vVecNods->nSize < lVar12) {
LAB_0044698e:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar2 = vVecNods->pArray[lVar12 + -1];
              if ((uVar10 >> ((int)lVar12 - 1U & 0x1f) & 1) == 0) {
                uVar13 = vVecNods_00->nCap;
                if (uVar14 == uVar13) {
                  if ((int)uVar13 < 0x10) {
                    if (vVecNods_00->pArray == (void **)0x0) {
                      ppvVar5 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar5 = (void **)realloc(vVecNods_00->pArray,0x80);
                    }
                    iVar15 = 0x10;
                  }
                  else {
                    iVar15 = uVar13 * 2;
                    if (iVar15 <= (int)uVar13) goto LAB_00446600;
                    if (vVecNods_00->pArray == (void **)0x0) {
                      ppvVar5 = (void **)malloc((ulong)uVar13 << 4);
                    }
                    else {
                      ppvVar5 = (void **)realloc(vVecNods_00->pArray,(ulong)uVar13 << 4);
                    }
                  }
                  vVecNods_00->pArray = ppvVar5;
                  vVecNods_00->nCap = iVar15;
                }
LAB_00446600:
                ppvVar5 = vVecNods_00->pArray;
                vVecNods_00->nSize = uVar14 + 1;
                uVar13 = uVar11;
                uVar11 = uVar14;
                uVar14 = uVar14 + 1;
              }
              else {
                uVar13 = vVecNods_01->nCap;
                if (uVar11 == uVar13) {
                  if ((int)uVar13 < 0x10) {
                    if (vVecNods_01->pArray == (void **)0x0) {
                      ppvVar5 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar5 = (void **)realloc(vVecNods_01->pArray,0x80);
                    }
                    iVar15 = 0x10;
                  }
                  else {
                    iVar15 = uVar13 * 2;
                    if (iVar15 <= (int)uVar13) goto LAB_004465ca;
                    if (vVecNods_01->pArray == (void **)0x0) {
                      ppvVar5 = (void **)malloc((ulong)uVar13 << 4);
                    }
                    else {
                      ppvVar5 = (void **)realloc(vVecNods_01->pArray,(ulong)uVar13 << 4);
                    }
                  }
                  vVecNods_01->pArray = ppvVar5;
                  vVecNods_01->nCap = iVar15;
                }
LAB_004465ca:
                ppvVar5 = vVecNods_01->pArray;
                vVecNods_01->nSize = uVar11 + 1;
                uVar13 = uVar11 + 1;
              }
              ppvVar5[(int)uVar11] = pvVar2;
              bVar17 = 1 < lVar12;
              lVar12 = lVar12 + -1;
              uVar11 = uVar13;
            } while (bVar17);
          }
          if ((int)uVar14 < 1) {
            __assert_fail("Vec_PtrSize(vVecNods0) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                          ,0xa4,
                          "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
          }
          if ((int)uVar13 < 1) {
            __assert_fail("Vec_PtrSize(vVecNods1) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                          ,0xa5,
                          "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
          }
          if (vVecNods->nSize <= (int)uVar14) {
            __assert_fail("Vec_PtrSize(vVecNods0) < Vec_PtrSize(vVecNods)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                          ,0xa6,
                          "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
          }
          if (vVecNods->nSize <= (int)uVar13) {
            __assert_fail("Vec_PtrSize(vVecNods1) < Vec_PtrSize(vVecNods)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                          ,0xa7,
                          "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
          }
          pVVar7 = Amap_CreateRulesVector_rec(p,vVecNods_00,fXor);
          pVVar8 = Amap_CreateRulesVector_rec(p,vVecNods_01,fXor);
          Amap_CreateRulesTwo(p,vNods,pVVar7,pVVar8,fXor);
          if (pVVar7->pArray != (int *)0x0) {
            free(pVVar7->pArray);
            pVVar7->pArray = (int *)0x0;
          }
          if (pVVar7 != (Vec_Int_t *)0x0) {
            free(pVVar7);
          }
          if (pVVar8->pArray != (int *)0x0) {
            free(pVVar8->pArray);
            pVVar8->pArray = (int *)0x0;
          }
          if (pVVar8 != (Vec_Int_t *)0x0) {
            free(pVVar8);
          }
          bVar17 = uVar10 != iVar3 - 3U;
          uVar10 = uVar10 + 1;
        } while (bVar17);
      }
    }
    if (vVecNods_00->pArray != (void **)0x0) {
      free(vVecNods_00->pArray);
      vVecNods_00->pArray = (void **)0x0;
    }
    free(vVecNods_00);
    if (vVecNods_01->pArray != (void **)0x0) {
      free(vVecNods_01->pArray);
      vVecNods_01->pArray = (void **)0x0;
    }
    free(vVecNods_01);
  }
  return vNods;
}

Assistant:

Vec_Int_t * Amap_CreateRulesVector_rec( Amap_Lib_t * p, Vec_Ptr_t * vVecNods, int fXor )
{
    Vec_Ptr_t * vVecNods0, * vVecNods1;
    Vec_Int_t * vRes, * vNods, * vNods0, * vNods1;
    int i, k;
    if ( Vec_PtrSize(vVecNods) == 1 )
        return Vec_IntDup( (Vec_Int_t *)Vec_PtrEntry(vVecNods, 0) );
    vRes = Vec_IntAlloc( 10 );
    vVecNods0 = Vec_PtrAlloc( Vec_PtrSize(vVecNods) );
    vVecNods1 = Vec_PtrAlloc( Vec_PtrSize(vVecNods) );
    if ( Amap_CreateCheckAllZero(vVecNods) )
    {
        for ( i = Vec_PtrSize(vVecNods)-1; i > 0; i-- )
        {
            Vec_PtrClear( vVecNods0 );
            Vec_PtrClear( vVecNods1 );
            Vec_PtrForEachEntryStop( Vec_Int_t *, vVecNods, vNods, k, i )
                Vec_PtrPush( vVecNods0, vNods );
            Vec_PtrForEachEntryStart( Vec_Int_t *, vVecNods, vNods, k, i )
                Vec_PtrPush( vVecNods1, vNods );
            vNods0 = Amap_CreateRulesVector_rec( p, vVecNods0, fXor );
            vNods1 = Amap_CreateRulesVector_rec( p, vVecNods1, fXor );
            Amap_CreateRulesTwo( p, vRes, vNods0, vNods1, fXor );
            Vec_IntFree( vNods0 );
            Vec_IntFree( vNods1 );
        }
    }
    else
    {
        int Limit = (1 << Vec_PtrSize(vVecNods))-2;
        for ( i = 1; i < Limit; i++ )
        {
            Vec_PtrClear( vVecNods0 );
            Vec_PtrClear( vVecNods1 );
            Vec_PtrForEachEntryReverse( Vec_Int_t *, vVecNods, vNods, k )
            {
                if ( i & (1 << k) )
                    Vec_PtrPush( vVecNods1, vNods );
                else
                    Vec_PtrPush( vVecNods0, vNods );
            }
            assert( Vec_PtrSize(vVecNods0) > 0 );
            assert( Vec_PtrSize(vVecNods1) > 0 );
            assert( Vec_PtrSize(vVecNods0) < Vec_PtrSize(vVecNods) );
            assert( Vec_PtrSize(vVecNods1) < Vec_PtrSize(vVecNods) );
            vNods0 = Amap_CreateRulesVector_rec( p, vVecNods0, fXor );
            vNods1 = Amap_CreateRulesVector_rec( p, vVecNods1, fXor );
            Amap_CreateRulesTwo( p, vRes, vNods0, vNods1, fXor );
            Vec_IntFree( vNods0 );
            Vec_IntFree( vNods1 );
        }
    }
    Vec_PtrFree( vVecNods0 );
    Vec_PtrFree( vVecNods1 );
    return vRes;
}